

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

void __thiscall CMeshClosestPointMapper::~CMeshClosestPointMapper(CMeshClosestPointMapper *this)

{
  ~CMeshClosestPointMapper(this);
  operator_delete(this,0x840);
  return;
}

Assistant:

virtual ~CMeshClosestPointMapper()
	{
		if (nullptr != m_pSourceCPM)
			delete m_pSourceCPM;
		m_pSourceCPM = nullptr;
#if !defined(OPENNURBS_PLUS)
    delete m_pMeshFaceTree;
#endif
	}